

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O0

void * get_column(ecs_iter_t *it,ecs_size_t size,int32_t column,int32_t row)

{
  _Bool _Var1;
  int local_28;
  int32_t local_24;
  int32_t table_column;
  int32_t row_local;
  int32_t column_local;
  ecs_size_t size_local;
  ecs_iter_t *it_local;
  
  if (column == 0) {
    it_local = (ecs_iter_t *)it->entities;
  }
  else {
    local_24 = row;
    table_column = column;
    row_local = size;
    _column_local = it;
    _Var1 = get_table_column(it,column,&local_28);
    if (_Var1) {
      if (local_28 < 0) {
        it_local = (ecs_iter_t *)get_shared_column(_column_local,row_local,local_28);
      }
      else {
        it_local = (ecs_iter_t *)get_owned_column_ptr(_column_local,row_local,local_28,local_24);
      }
    }
    else {
      it_local = (ecs_iter_t *)0x0;
    }
  }
  return it_local;
}

Assistant:

static
void* get_column(
    const ecs_iter_t *it,
    ecs_size_t size,
    int32_t column,
    int32_t row)
{
    int32_t table_column;

    if (!column) {
        return it->entities;
    }

    if (!get_table_column(it, column, &table_column)) {
        return NULL;
    }

    if (table_column < 0) {
        return (void*)get_shared_column(it, size, table_column);
    } else {
        return get_owned_column_ptr(it, size, table_column, row);
    }
}